

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall
cppcms::widgets::base_html_input::render_input(base_html_input *this,form_context *context)

{
  widget_part_type wVar1;
  html_type hVar2;
  ostream *poVar3;
  form_context *in_RSI;
  long *in_RDI;
  ostream *output;
  form_context *in_stack_000000d8;
  base_widget *in_stack_000000e0;
  
  base_widget::auto_generate(in_stack_000000e0,in_stack_000000d8);
  poVar3 = form_context::out((form_context *)this);
  wVar1 = form_context::widget_part(in_RSI);
  if (wVar1 == first_part) {
    poVar3 = std::operator<<(poVar3,"<input type=\"");
    poVar3 = std::operator<<(poVar3,(string *)(in_RDI + 2));
    std::operator<<(poVar3,"\" ");
    (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18)) + 0x48))
              ((long)in_RDI + *(long *)(*in_RDI + -0x18),in_RSI);
    (**(code **)(*in_RDI + 0x18))(in_RDI,in_RSI);
  }
  else {
    hVar2 = form_context::html(in_RSI);
    if (hVar2 == as_xhtml) {
      std::operator<<(poVar3," />");
    }
    else {
      std::operator<<(poVar3," >");
    }
  }
  return;
}

Assistant:

void base_html_input::render_input(form_context &context)
{
	auto_generate(&context);

	std::ostream &output=context.out();
	if(context.widget_part() == first_part) {
		output<<"<input type=\""<<type_<<"\" ";
		render_attributes(context);
		render_value(context);
	}
	else {
		if(context.html() ==  as_xhtml)
			output<<" />";
		else
			output<<" >";
	}
}